

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

word Lms_DelayMax(word D1,word D2,int nVars)

{
  int iVar1;
  int iVar2;
  word local_30;
  word D;
  int local_20;
  int Max;
  int v;
  int nVars_local;
  word D2_local;
  word D1_local;
  
  local_30 = 0;
  Max = nVars;
  _v = D2;
  D2_local = D1;
  for (local_20 = 0; local_20 < Max; local_20 = local_20 + 1) {
    iVar1 = Lms_DelayGet(D2_local,local_20);
    iVar2 = Lms_DelayGet(_v,local_20);
    D._4_4_ = Abc_MaxInt(iVar1,iVar2);
    iVar1 = local_20;
    if (D._4_4_ != 0) {
      iVar2 = Abc_MinInt(D._4_4_ + 1,0xf);
      Lms_DelaySet(&local_30,iVar1,iVar2);
    }
  }
  return local_30;
}

Assistant:

static inline word Lms_DelayMax( word D1, word D2, int nVars )
{
    int v, Max;
    word D = 0;
    for ( v = 0; v < nVars; v++ )
        if ( (Max = Abc_MaxInt(Lms_DelayGet(D1, v), Lms_DelayGet(D2, v))) )
            Lms_DelaySet( &D, v, Abc_MinInt(Max + 1, 15) );
    return D;
}